

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall QHttpThreadDelegate::finishedSlot(QHttpThreadDelegate *this)

{
  bool bVar1;
  int iVar2;
  QHttpNetworkReply *in_RDI;
  long in_FS_OFFSET;
  QString msg;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  QHttpNetworkReply *this_00;
  QHttpNetworkReply *in_stack_ffffffffffffff38;
  QString *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  QLatin1StringView in_stack_ffffffffffffff50;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_8c;
  QUrl local_88;
  undefined1 local_80 [64];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if (*(long *)(in_RDI + 0xe) != 0) {
    while (bVar1 = QHttpNetworkReply::readAnyAvailable
                             ((QHttpNetworkReply *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)), bVar1)
    {
      std::__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x30f5c1);
      QBasicAtomicInteger<int>::fetchAndAddRelease
                ((QBasicAtomicInteger<int> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c);
      QHttpNetworkReply::readAny(in_stack_ffffffffffffff38);
      downloadData((QHttpThreadDelegate *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (QByteArray *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QByteArray::~QByteArray((QByteArray *)0x30f606);
    }
    if (((ulong)(in_RDI->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader & 1) != 0) {
      QHttpNetworkReply::sslConfiguration(in_stack_ffffffffffffff38);
      sslConfigurationChanged
                ((QHttpThreadDelegate *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (QSslConfiguration *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
      ;
      QSslConfiguration::~QSslConfiguration((QSslConfiguration *)0x30f64b);
    }
    iVar2 = QHttpNetworkReply::statusCode((QHttpNetworkReply *)0x30f65c);
    if (399 < iVar2) {
      local_40 = 0xaaaaaaaaaaaaaaaa;
      local_38 = 0xaaaaaaaaaaaaaaaa;
      local_30 = 0xaaaaaaaaaaaaaaaa;
      QLatin1String::QLatin1String((QLatin1String *)this_00,(char *)in_RDI);
      QString::QString((QString *)this_00,in_stack_ffffffffffffff50);
      QHttpNetworkRequest::url((QHttpNetworkRequest *)in_RDI);
      QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                (&local_8c,PrettyDecoded);
      QUrl::toString((QUrlTwoFlags_conflict1 *)local_80);
      QHttpNetworkReply::reasonPhrase(in_RDI);
      QString::arg<QString,QString>
                ((QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff40,(QString *)in_stack_ffffffffffffff38);
      QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QString::~QString((QString *)0x30f74e);
      QString::~QString((QString *)0x30f758);
      QString::~QString((QString *)0x30f762);
      QUrl::~QUrl(&local_88);
      in_stack_ffffffffffffff24 = QHttpNetworkReply::statusCode((QHttpNetworkReply *)0x30f77d);
      QHttpNetworkRequest::url((QHttpNetworkRequest *)in_RDI);
      statusCodeFromHttp(in_stack_ffffffffffffff48,(QUrl *)in_stack_ffffffffffffff40);
      error((QHttpThreadDelegate *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
            (NetworkError)((ulong)in_RDI >> 0x20),
            (QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QUrl::~QUrl((QUrl *)&stack0xffffffffffffff50);
      QString::~QString((QString *)0x30f7cd);
    }
    bVar1 = QHttpNetworkRequest::isFollowRedirects((QHttpNetworkRequest *)0x30f7db);
    if ((bVar1) && (bVar1 = QHttpNetworkReply::isRedirecting((QHttpNetworkReply *)0x30f7f5), bVar1))
    {
      QHttpNetworkReply::redirectUrl(in_RDI);
      iVar2 = QHttpNetworkReply::statusCode((QHttpNetworkReply *)0x30f822);
      QHttpNetworkReply::request(in_RDI);
      QHttpNetworkRequest::redirectCount((QHttpNetworkRequest *)0x30f848);
      redirected((QHttpThreadDelegate *)CONCAT44(in_stack_ffffffffffffff24,iVar2),
                 (QUrl *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      QHttpNetworkRequest::~QHttpNetworkRequest
                ((QHttpNetworkRequest *)CONCAT44(in_stack_ffffffffffffff24,iVar2));
      QUrl::~QUrl((QUrl *)&stack0xffffffffffffff48);
    }
    downloadFinished((QHttpThreadDelegate *)0x30f87e);
    QMetaObject::invokeMethod<>
              (&in_stack_ffffffffffffff38->super_QObject,(char *)this_00,
               (ConnectionType)((ulong)in_RDI >> 0x20));
    QMetaObject::invokeMethod<>
              (&in_stack_ffffffffffffff38->super_QObject,(char *)this_00,
               (ConnectionType)((ulong)in_RDI >> 0x20));
    *(undefined8 *)(in_RDI + 0xe) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpThreadDelegate::finishedSlot()
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::finishedSlot() thread=" << QThread::currentThreadId() << "result=" << httpReply->statusCode();
#endif

    // If there is still some data left emit that now
    while (httpReply->readAnyAvailable()) {
        pendingDownloadData->fetchAndAddRelease(1);
        emit downloadData(httpReply->readAny());
    }

#ifndef QT_NO_SSL
    if (ssl)
        emit sslConfigurationChanged(httpReply->sslConfiguration());
#endif

    if (httpReply->statusCode() >= 400) {
            // it's an error reply
            QString msg = QLatin1StringView(QT_TRANSLATE_NOOP("QNetworkReply",
                                                              "Error transferring %1 - server replied: %2"));
            msg = msg.arg(httpRequest.url().toString(), httpReply->reasonPhrase());
            emit error(statusCodeFromHttp(httpReply->statusCode(), httpRequest.url()), msg);
        }

    if (httpRequest.isFollowRedirects() && httpReply->isRedirecting())
        emit redirected(httpReply->redirectUrl(), httpReply->statusCode(), httpReply->request().redirectCount() - 1);

    emit downloadFinished();

    QMetaObject::invokeMethod(httpReply, "deleteLater", Qt::QueuedConnection);
    QMetaObject::invokeMethod(this, "deleteLater", Qt::QueuedConnection);
    httpReply = nullptr;
}